

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

void __thiscall Js::AsmJsModuleInfo::SetFunctionTableCount(AsmJsModuleInfo *this,int val)

{
  code *pcVar1;
  bool bVar2;
  ModuleFunctionTable **ppMVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  ModuleFunctionTable *ptr;
  TrackAllocData local_40;
  int local_14;
  AsmJsModuleInfo *pAStack_10;
  int val_local;
  AsmJsModuleInfo *this_local;
  
  local_14 = val;
  pAStack_10 = this;
  ppMVar3 = Memory::WriteBarrierPtr::operator_cast_to_ModuleFunctionTable__
                      ((WriteBarrierPtr *)&this->mFunctionTables);
  if (*ppMVar3 != (ModuleFunctionTable *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                ,0x675,"(mFunctionTables == nullptr)","mFunctionTables == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->mFunctionTableCount = local_14;
  pRVar5 = this->mRecycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&ModuleFunctionTable::typeinfo,0,(long)local_14,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
             ,0x677);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
  ptr = Memory::AllocateArray<Memory::Recycler,Js::AsmJsModuleInfo::ModuleFunctionTable,false>
                  ((Memory *)pRVar5,(Recycler *)Memory::Recycler::Alloc,0,(long)local_14);
  Memory::WriteBarrierPtr<Js::AsmJsModuleInfo::ModuleFunctionTable>::operator=
            (&this->mFunctionTables,ptr);
  return;
}

Assistant:

void AsmJsModuleInfo::SetFunctionTableCount(int val)
    {
        Assert(mFunctionTables == nullptr);
        mFunctionTableCount = val;
        mFunctionTables = RecyclerNewArray(mRecycler, ModuleFunctionTable, val);
    }